

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost.h
# Opt level: O1

double brotli::PopulationCost<704>(Histogram<704> *histogram)

{
  bool bVar1;
  int i;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined4 uVar13;
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  uint8_t depth_array [704];
  int local_348 [20];
  byte local_2f8 [712];
  
  uVar9 = histogram->total_count_;
  dVar17 = 12.0;
  if (uVar9 != 0) {
    lVar2 = 0;
    uVar4 = 0;
    do {
      uVar4 = (uVar4 + 1) - (uint)(histogram->data_[lVar2] == 0);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x2c0);
    if (uVar4 != 1) {
      if (uVar4 == 2) {
        lVar2 = uVar9 + 0x14;
        auVar11._8_4_ = (int)((ulong)lVar2 >> 0x20);
        auVar11._0_8_ = lVar2;
        auVar11._12_4_ = 0x45300000;
        dVar17 = auVar11._8_8_ - 1.9342813113834067e+25;
        dVar10 = (double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0;
      }
      else {
        memset(local_2f8,0,0x2c0);
        if (uVar4 < 5) {
          CreateHuffmanTree(histogram->data_,0x2c0,0xf,local_2f8);
          dVar17 = 0.0;
          lVar2 = 0;
          do {
            dVar17 = dVar17 + (double)((uint)local_2f8[lVar2] * histogram->data_[lVar2]);
            lVar2 = lVar2 + 1;
          } while (lVar2 != 0x2c0);
          return dVar17 + *(double *)(&DAT_001ce250 + (ulong)(uVar4 == 3) * 8);
        }
        local_348[0xc] = 0;
        local_348[0xd] = 0;
        local_348[0xe] = 0;
        local_348[0xf] = 0;
        local_348[8] = 0;
        local_348[9] = 0;
        local_348[10] = 0;
        local_348[0xb] = 0;
        local_348[4] = 0;
        local_348[5] = 0;
        local_348[6] = 0;
        local_348[7] = 0;
        local_348[0] = 0;
        local_348[1] = 0;
        local_348[2] = 0;
        local_348[3] = 0;
        local_348[0x10] = 0;
        local_348[0x11] = 0;
        if (uVar9 < 0x100) {
          dVar18 = (double)*(float *)(kLog2Table + uVar9 * 4);
        }
        else {
          auVar15._8_4_ = (int)(uVar9 >> 0x20);
          auVar15._0_8_ = uVar9;
          auVar15._12_4_ = 0x45300000;
          dVar18 = log2((auVar15._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
        }
        dVar17 = 0.0;
        uVar9 = 1;
        uVar7 = 0;
        iVar5 = local_348[0x11];
        do {
          uVar3 = (ulong)histogram->data_[uVar7];
          if (uVar3 == 0) {
            uVar4 = 1;
            if (uVar7 < 0x2bf) {
              uVar4 = 0x2c0 - (int)uVar7;
              lVar2 = 0;
              do {
                if (histogram->data_[uVar7 + lVar2 + 1] != 0) {
                  uVar4 = (int)lVar2 + 1;
                  break;
                }
                lVar2 = lVar2 + 1;
              } while (0x2bf - uVar7 != lVar2);
            }
            uVar7 = uVar7 + uVar4;
            if (uVar7 != 0x2c0) {
              if (uVar4 < 3) {
                local_348[0] = local_348[0] + uVar4;
              }
              else {
                uVar4 = uVar4 - 2;
                if (uVar4 != 0) {
                  do {
                    iVar5 = iVar5 + 1;
                    dVar17 = dVar17 + 3.0;
                    bVar1 = 7 < uVar4;
                    uVar4 = uVar4 >> 3;
                  } while (bVar1);
                }
              }
            }
            if (uVar7 == 0x2c0) break;
          }
          else {
            if (histogram->data_[uVar7] < 0x100) {
              dVar10 = (double)*(float *)(kLog2Table + uVar3 * 4);
            }
            else {
              dVar10 = log2((double)uVar3);
            }
            dVar14 = (dVar18 - dVar10) + 0.5;
            uVar3 = (ulong)dVar14;
            uVar3 = (long)(dVar14 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
            dVar17 = dVar17 + (double)histogram->data_[uVar7] * (dVar18 - dVar10);
            if (0xe < uVar3) {
              uVar3 = 0xf;
            }
            if (uVar9 < uVar3) {
              uVar9 = uVar3;
            }
            local_348[uVar3 & 0xffffffff] = local_348[uVar3 & 0xffffffff] + 1;
            uVar7 = uVar7 + 1;
          }
        } while (uVar7 < 0x2c0);
        local_348[0x11] = iVar5;
        dVar18 = 0.0;
        uVar3 = 0xfffffffffffffff8;
        uVar7 = 0;
        do {
          uVar6 = (ulong)*(uint *)((long)local_348 + uVar3 + 8);
          if (uVar6 < 0x100) {
            dVar10 = (double)*(float *)(kLog2Table + uVar6 * 4);
          }
          else {
            dVar10 = log2((double)uVar6);
          }
          uVar8 = (ulong)*(uint *)((long)local_348 + uVar3 + 0xc);
          if (uVar8 < 0x100) {
            dVar14 = (double)*(float *)(kLog2Table + uVar8 * 4);
          }
          else {
            dVar14 = log2((double)uVar8);
          }
          uVar7 = uVar7 + uVar6 + uVar8;
          dVar18 = (dVar18 - (double)uVar6 * dVar10) - (double)uVar8 * dVar14;
          uVar3 = uVar3 + 8;
        } while (uVar3 < 0x40);
        dVar17 = dVar17 + (double)(long)(uVar9 * 2 + 0x12);
        uVar13 = (undefined4)(uVar7 >> 0x20);
        if (uVar7 != 0) {
          auVar12._8_4_ = uVar13;
          auVar12._0_8_ = uVar7;
          auVar12._12_4_ = 0x45300000;
          dVar10 = (auVar12._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
          if (uVar7 < 0x100) {
            dVar14 = (double)*(float *)(kLog2Table + uVar7 * 4);
          }
          else {
            dVar14 = log2(dVar10);
          }
          dVar18 = dVar18 + dVar10 * dVar14;
        }
        auVar16._8_4_ = uVar13;
        auVar16._0_8_ = uVar7;
        auVar16._12_4_ = 0x45300000;
        dVar10 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
        if (dVar10 <= dVar18) {
          dVar10 = dVar18;
        }
      }
      dVar17 = dVar17 + dVar10;
    }
  }
  return dVar17;
}

Assistant:

double PopulationCost(const Histogram<kSize>& histogram) {
  if (histogram.total_count_ == 0) {
    return 12;
  }
  int count = 0;
  for (int i = 0; i < kSize; ++i) {
    if (histogram.data_[i] > 0) {
      ++count;
    }
  }
  if (count == 1) {
    return 12;
  }
  if (count == 2) {
    return static_cast<double>(20 + histogram.total_count_);
  }
  double bits = 0;
  uint8_t depth_array[kSize] = { 0 };
  if (count <= 4) {
    // For very low symbol count we build the Huffman tree.
    CreateHuffmanTree(&histogram.data_[0], kSize, 15, depth_array);
    for (int i = 0; i < kSize; ++i) {
      bits += histogram.data_[i] * depth_array[i];
    }
    return count == 3 ? bits + 28 : bits + 37;
  }

  // In this loop we compute the entropy of the histogram and simultaneously
  // build a simplified histogram of the code length codes where we use the
  // zero repeat code 17, but we don't use the non-zero repeat code 16.
  size_t max_depth = 1;
  uint32_t depth_histo[kCodeLengthCodes] = { 0 };
  const double log2total = FastLog2(histogram.total_count_);
  for (size_t i = 0; i < kSize;) {
    if (histogram.data_[i] > 0) {
      // Compute -log2(P(symbol)) = -log2(count(symbol)/total_count) =
      //                          =  log2(total_count) - log2(count(symbol))
      double log2p = log2total - FastLog2(histogram.data_[i]);
      // Approximate the bit depth by round(-log2(P(symbol)))
      size_t depth = static_cast<size_t>(log2p + 0.5);
      bits += histogram.data_[i] * log2p;
      if (depth > 15) {
        depth = 15;
      }
      if (depth > max_depth) {
        max_depth = depth;
      }
      ++depth_histo[depth];
      ++i;
    } else {
      // Compute the run length of zeros and add the appropriate number of 0 and
      // 17 code length codes to the code length code histogram.
      uint32_t reps = 1;
      for (size_t k = i + 1; k < kSize && histogram.data_[k] == 0; ++k) {
        ++reps;
      }
      i += reps;
      if (i == kSize) {
        // Don't add any cost for the last zero run, since these are encoded
        // only implicitly.
        break;
      }
      if (reps < 3) {
        depth_histo[0] += reps;
      } else {
        reps -= 2;
        while (reps > 0) {
          ++depth_histo[17];
          // Add the 3 extra bits for the 17 code length code.
          bits += 3;
          reps >>= 3;
        }
      }
    }
  }
  // Add the estimated encoding cost of the code length code histogram.
  bits += static_cast<double>(18 + 2 * max_depth);
  // Add the entropy of the code length code histogram.
  bits += BitsEntropy(depth_histo, kCodeLengthCodes);
  return bits;
}